

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_exists(Context *context,IntrinsicResult partialResult)

{
  int iVar1;
  char *__name;
  Value path;
  Value local_58;
  String pathStr;
  Value local_38;
  String local_28;
  
  MiniScript::String::String(&local_28,"path");
  MiniScript::Context::GetVar((Context *)&path,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  MiniScript::String::release(&local_28);
  if (path.type == Null) {
    MiniScript::Value::Value(&local_38,(Value *)MiniScript::Value::null);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
    MiniScript::Value::~Value(&local_38);
  }
  else {
    MiniScript::Value::ToString((Value *)&pathStr,(Machine *)&path);
    if (pathStr.ss == (StringStorage *)0x0) {
      __name = "";
    }
    else {
      __name = (pathStr.ss)->data;
    }
    iVar1 = access(__name,0);
    MiniScript::Value::Truth(&local_58,iVar1 != -1);
    MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_58,true);
    MiniScript::Value::~Value(&local_58);
    MiniScript::String::release(&pathStr);
  }
  MiniScript::Value::~Value(&path);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_exists(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::null);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char pathBuf[512];
		_fullpath(pathBuf, pathStr.c_str(), sizeof(pathBuf));
		WIN32_FIND_DATA FindFileData;
		HANDLE handle = FindFirstFile(pathBuf, &FindFileData) ;
		bool found = handle != INVALID_HANDLE_VALUE;
		if (found) FindClose(handle);
	#else
		bool found = (access(pathStr.c_str(), F_OK ) != -1);
	#endif
	return IntrinsicResult(Value::Truth(found));
}